

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

bool tcu::floatUlpThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,CompareLogMode logMode)

{
  ostringstream *poVar1;
  TestLog *this;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  TextureChannelClass TVar6;
  TestError *this_00;
  Vec4 *bias;
  ConstPixelBufferAccess *pCVar7;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int iVar8;
  int iVar9;
  string *this_01;
  int z;
  Vec4 *pVVar10;
  uint height;
  int iVar11;
  allocator<char> local_4d4;
  allocator<char> local_4d3;
  allocator<char> local_4d2;
  allocator<char> local_4d1;
  allocator<char> local_4d0;
  allocator<char> local_4cf;
  allocator<char> local_4ce;
  allocator<char> local_4cd;
  int local_4cc;
  ConstPixelBufferAccess *local_4c8;
  UVec4 *local_4c0;
  int local_4b8;
  uint local_4b4;
  int local_4b0;
  uint local_4ac;
  Vec4 local_4a8;
  Vec4 local_498;
  char *local_488;
  char *local_480;
  Vector<unsigned_int,_4> local_478;
  TestLog *local_468;
  string local_460;
  string local_440;
  LogImageSet local_420;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  UVec4 diff;
  Vec4 cmpPix;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  Vec4 refPix;
  
  iVar9 = (reference->m_size).m_data[0];
  height = (reference->m_size).m_data[1];
  iVar11 = (reference->m_size).m_data[2];
  refPix.m_data[0] = 9.80909e-45;
  refPix.m_data[1] = 4.2039e-45;
  bias = (Vec4 *)(ulong)height;
  local_4c8 = reference;
  local_4c0 = threshold;
  local_488 = imageSetDesc;
  local_480 = imageSetName;
  local_468 = log;
  TextureLevel::TextureLevel(&errorMaskStorage,(TextureFormat *)&refPix,iVar9,height,iVar11);
  TextureLevel::getAccess(&errorMask,&errorMaskStorage);
  local_478.m_data[0] = 0;
  local_478.m_data[1] = 0;
  local_478.m_data[2] = 0;
  local_478.m_data[3] = 0;
  local_498.m_data[0] = 0.0;
  local_498.m_data[1] = 0.0;
  local_498.m_data[2] = 0.0;
  local_498.m_data[3] = 0.0;
  local_4a8.m_data[0] = 1.0;
  local_4a8.m_data[1] = 1.0;
  local_4a8.m_data[2] = 1.0;
  local_4a8.m_data[3] = 1.0;
  if ((((result->m_size).m_data[0] != iVar9) || ((result->m_size).m_data[1] != height)) ||
     ((result->m_size).m_data[2] != iVar11)) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              (this_00,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,499);
    __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
  }
  iVar8 = 0;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if ((int)height < 1) {
    height = 0;
  }
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  local_4b8 = iVar11;
  local_4b4 = height;
  for (; iVar8 != local_4b8; iVar8 = iVar8 + 1) {
    pVVar10 = (Vec4 *)0x0;
    local_4b0 = iVar8;
    while ((uint)pVVar10 != local_4b4) {
      iVar11 = 0;
      local_4ac = (uint)pVVar10;
      while( true ) {
        z = (int)pVVar10;
        if (iVar9 == iVar11) break;
        ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&refPix,(int)local_4c8,iVar11,z);
        local_4cc = iVar11;
        ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&cmpPix,(int)result,iVar11,z);
        dVar3 = computeFloatFlushRelaxedULPDiff(refPix.m_data[0],cmpPix.m_data[0]);
        dVar4 = computeFloatFlushRelaxedULPDiff(refPix.m_data[1],cmpPix.m_data[1]);
        dVar5 = computeFloatFlushRelaxedULPDiff(refPix.m_data[2],cmpPix.m_data[2]);
        diff.m_data[3] = computeFloatFlushRelaxedULPDiff(refPix.m_data[3],cmpPix.m_data[3]);
        diff.m_data[0] = dVar3;
        diff.m_data[1] = dVar4;
        diff.m_data[2] = dVar5;
        lessThanEqual<unsigned_int,4>((tcu *)&local_420,&diff,local_4c0);
        bVar2 = boolAll<4>((Vector<bool,_4> *)&local_420);
        max<unsigned_int,4>((tcu *)&local_420,&local_478,&diff);
        iVar8 = local_4b0;
        iVar11 = local_4cc;
        local_478.m_data[1] = local_420.m_name._M_dataplus._M_p._4_4_;
        local_478.m_data[0] = (uint)local_420.m_name._M_dataplus._M_p;
        local_478.m_data[2] = (undefined4)local_420.m_name._M_string_length;
        local_478.m_data[3] = local_420.m_name._M_string_length._4_4_;
        local_420.m_name._M_dataplus._M_p._4_4_ = 0;
        if (bVar2) {
          local_420.m_name._M_dataplus._M_p._0_4_ = 0;
          local_420.m_name._M_dataplus._M_p._4_4_ = 0x3f800000;
        }
        else {
          local_420.m_name._M_dataplus._M_p._0_4_ = 0x3f800000;
        }
        local_420.m_name._M_string_length = 0x3f80000000000000;
        pVVar10 = (Vec4 *)(ulong)local_4ac;
        bias = pVVar10;
        PixelBufferAccess::setPixel(&errorMask,(Vec4 *)&local_420,local_4cc,local_4ac,local_4b0);
        iVar11 = iVar11 + 1;
      }
      pVVar10 = (Vec4 *)(ulong)(z + 1);
    }
  }
  lessThanEqual<unsigned_int,4>((tcu *)&refPix,&local_478,local_4c0);
  bVar2 = boolAll<4>((Vector<bool,_4> *)&refPix);
  this = local_468;
  iVar9 = (int)local_468;
  if (logMode == COMPARE_LOG_EVERYTHING || !bVar2) {
    TVar6 = getTextureChannelClass((local_4c8->m_format).type);
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      TVar6 = getTextureChannelClass((result->m_format).type);
      if (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_0091a2a9;
    }
    else {
LAB_0091a2a9:
      bias = &local_498;
      anon_unknown_50::computeScaleAndBias(local_4c8,result,&local_4a8,bias);
      poVar1 = (ostringstream *)(refPix.m_data + 2);
      refPix.m_data._0_8_ = this;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Result and reference images are normalized with formula p * ");
      operator<<((ostream *)poVar1,&local_4a8);
      std::operator<<((ostream *)poVar1," + ");
      operator<<((ostream *)poVar1,&local_498);
      MessageBuilder::operator<<((MessageBuilder *)&refPix,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    if (!bVar2) {
      poVar1 = (ostringstream *)(refPix.m_data + 2);
      refPix.m_data._0_8_ = this;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Image comparison failed: max difference = ");
      operator<<((ostream *)poVar1,&local_478);
      std::operator<<((ostream *)poVar1,", threshold = ");
      operator<<((ostream *)poVar1,local_4c0);
      MessageBuilder::operator<<((MessageBuilder *)&refPix,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,local_480,&local_4cd);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,local_488,&local_4ce);
    LogImageSet::LogImageSet(&local_420,&local_440,&local_460);
    LogImageSet::write(&local_420,iVar9,__buf_01,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"Result",&local_4cf);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Result",&local_4d0);
    LogImage::LogImage((LogImage *)&refPix,&local_380,&local_3a0,result,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&refPix,iVar9,__buf_02,(size_t)result);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Reference",&local_4d1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"Reference",&local_4d2);
    pCVar7 = local_4c8;
    LogImage::LogImage((LogImage *)&cmpPix,&local_3c0,&local_3e0,local_4c8,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&cmpPix,iVar9,__buf_03,(size_t)pCVar7);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"ErrorMask",&local_4d3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Error mask",&local_4d4)
    ;
    pCVar7 = &errorMask.super_ConstPixelBufferAccess;
    LogImage::LogImage((LogImage *)&diff,&local_340,&local_360,pCVar7,QP_IMAGE_COMPRESSION_MODE_BEST
                      );
    LogImage::write((LogImage *)&diff,iVar9,__buf_04,(size_t)pCVar7);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&diff);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    LogImage::~LogImage((LogImage *)&cmpPix);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
    LogImage::~LogImage((LogImage *)&refPix);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    LogImageSet::~LogImageSet(&local_420);
    std::__cxx11::string::~string((string *)&local_460);
    this_01 = &local_440;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_0091a5eb;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_4a8,&local_498);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&diff,local_480,(allocator<char> *)&local_380);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,local_488,(allocator<char> *)&local_3a0);
    LogImageSet::LogImageSet((LogImageSet *)&cmpPix,(string *)&diff,&local_420.m_name);
    LogImageSet::write((LogImageSet *)&cmpPix,iVar9,__buf,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"Result",(allocator<char> *)&local_3c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"Result",(allocator<char> *)&local_3e0);
    LogImage::LogImage((LogImage *)&refPix,&local_440,&local_460,result,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&refPix,iVar9,__buf_00,(size_t)result);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&refPix);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
    LogImageSet::~LogImageSet((LogImageSet *)&cmpPix);
    std::__cxx11::string::~string((string *)&local_420);
    this_01 = (string *)&diff;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_0091a5eb:
  TextureLevel::~TextureLevel(&errorMaskStorage);
  return bVar2;
}

Assistant:

bool floatUlpThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	UVec4				maxDiff				(0, 0, 0, 0);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				const Vec4	refPix	= reference.getPixel(x, y, z);
				const Vec4	cmpPix	= result.getPixel(x, y, z);
				const UVec4	diff	= computeFlushRelaxedULPDiff(refPix, cmpPix);
				const bool	isOk	= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}